

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

void fdb_kvs_header_read(kvs_header *kv_header,docio_handle *dhandle,uint64_t kv_info_offset,
                        uint64_t version,bool only_seq_nums)

{
  int64_t iVar1;
  size_t len;
  docio_object local_68;
  
  local_68.field_3.seqnum = 0;
  local_68.meta = (void *)0x0;
  local_68.timestamp = 0;
  local_68._20_4_ = 0;
  local_68.key = (void *)0x0;
  local_68.length.keylen = 0;
  local_68.length.metalen = 0;
  local_68.length.bodylen = 0;
  local_68.length.bodylen_ondisk = 0;
  local_68.length.flag = '\0';
  local_68.length.checksum = '\0';
  local_68.length.reserved = 0;
  local_68.body = (void *)0x0;
  iVar1 = docio_read_doc(dhandle,kv_info_offset,&local_68,true);
  if (iVar1 < 1) {
    fdb_log_impl(dhandle->log_callback,2,(fdb_status)iVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                 ,"fdb_kvs_header_read",0x4ae,
                 "Failed to read a KV header with the offset %lu from a database file \'%s\'",
                 kv_info_offset,dhandle->file->filename);
  }
  else {
    _fdb_kvs_header_import(kv_header,local_68.body,len,version,only_seq_nums);
    free_docio_object(&local_68,'\x01','\x01','\x01');
  }
  return;
}

Assistant:

void fdb_kvs_header_read(struct kvs_header *kv_header,
                         struct docio_handle *dhandle,
                         uint64_t kv_info_offset,
                         uint64_t version,
                         bool only_seq_nums)
{
    int64_t offset;
    struct docio_object doc;

    memset(&doc, 0, sizeof(struct docio_object));
    offset = docio_read_doc(dhandle, kv_info_offset, &doc, true);

    if (offset <= 0) {
        fdb_log(dhandle->log_callback, FDB_LOG_ERROR, (fdb_status) offset,
                "Failed to read a KV header with the offset %" _F64 " from a "
                "database file '%s'", kv_info_offset, dhandle->file->filename);
        return;
    }

    _fdb_kvs_header_import(kv_header, doc.body, doc.length.bodylen,
                           version, only_seq_nums);
    free_docio_object(&doc, 1, 1, 1);
}